

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteKvIoPageDontJournal(unqlite_page *pRaw)

{
  uchar *puVar1;
  int iVar2;
  Pager *pPager;
  Page *pPage;
  unqlite_page *pRaw_local;
  
  if ((((pRaw != (unqlite_page *)0x0) && (puVar1 = pRaw[1].zData, 1 < *(int *)(puVar1 + 0x1f0))) &&
      (*(int *)(puVar1 + 0x204) == 0)) &&
     ((*(long *)(puVar1 + 0x198) != 0 &&
      (iVar2 = unqliteBitvecTest(*(Bitvec **)(puVar1 + 0x198),pRaw->iPage), iVar2 == 0)))) {
    unqliteBitvecSet(*(Bitvec **)(puVar1 + 0x198),pRaw->iPage);
  }
  return 0;
}

Assistant:

static int unqliteKvIoPageDontJournal(unqlite_page *pRaw)
{
	Page *pPage = (Page *)pRaw;
	Pager *pPager;
	if( pPage == 0 ){
		/* TICKET 1433-0348 */
		return UNQLITE_OK;
	}
	pPager = pPage->pPager;
	if( pPager->iState >= PAGER_WRITER_LOCKED ){
		if( !pPager->no_jrnl && pPager->pVec && !unqliteBitvecTest(pPager->pVec,pPage->pgno) ){
			unqliteBitvecSet(pPager->pVec,pPage->pgno);
		}
	}
	return UNQLITE_OK;
}